

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void vkt::synchronization::anon_unknown_0::ShaderAccess::initPassthroughPrograms
               (SourceCollections *programCollection,string *shaderPrefix,string *declCode,
               string *mainCode,VkShaderStageFlagBits stage)

{
  VkShaderStageFlags VVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  string local_d60;
  ShaderSource local_d40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d18;
  byte local_cf2;
  allocator<char> local_cf1;
  string local_cf0 [38];
  byte local_cca;
  allocator<char> local_cc9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  ostringstream local_ca8 [8];
  ostringstream src_5;
  string local_b30;
  ShaderSource local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  byte local_ac2;
  allocator<char> local_ac1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  byte local_a9a;
  allocator<char> local_a99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  ostringstream local_a78 [8];
  ostringstream src_4;
  string local_900;
  ShaderSource local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  byte local_892;
  allocator<char> local_891;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  byte local_86a;
  allocator<char> local_869;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  ostringstream local_848 [8];
  ostringstream src_3;
  string local_6d0;
  ShaderSource local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  byte local_662;
  allocator<char> local_661;
  string local_660 [38];
  byte local_63a;
  allocator<char> local_639;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  ostringstream local_618 [8];
  ostringstream src_2;
  string local_4a0;
  ShaderSource local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  byte local_432;
  allocator<char> local_431;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  byte local_40a;
  allocator<char> local_409;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  ostringstream local_3e8 [8];
  ostringstream src_1;
  string local_270;
  ShaderSource local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  byte local_202;
  allocator<char> local_201;
  string local_200 [38];
  byte local_1da;
  allocator<char> local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  ostringstream local_1a8 [8];
  ostringstream src;
  VkShaderStageFlags requiredStages;
  VkShaderStageFlagBits stage_local;
  string *mainCode_local;
  string *declCode_local;
  string *shaderPrefix_local;
  SourceCollections *programCollection_local;
  
  VVar1 = getRequiredStages(stage);
  if ((VVar1 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar3 = std::operator<<((ostream *)local_1a8,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) in vec4 v_in_position;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"out ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3,";\n");
    poVar3 = std::operator<<(poVar3,"\n");
    local_1da = 0;
    if ((stage & VK_SHADER_STAGE_VERTEX_BIT) == 0) {
      std::allocator<char>::allocator();
      local_1da = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_1d9);
    }
    else {
      std::operator+(&local_1d8,declCode,"\n");
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    gl_Position = v_in_position;\n");
    local_202 = 0;
    if ((stage & VK_SHADER_STAGE_VERTEX_BIT) == 0) {
      std::allocator<char>::allocator();
      local_202 = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_200,"",&local_201);
    }
    else {
      std::__cxx11::string::string(local_200,(string *)mainCode);
    }
    poVar3 = std::operator<<(poVar3,local_200);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string(local_200);
    if ((local_202 & 1) != 0) {
      std::allocator<char>::~allocator(&local_201);
    }
    std::__cxx11::string::~string((string *)&local_1d8);
    if ((local_1da & 1) != 0) {
      std::allocator<char>::~allocator(&local_1d9);
    }
    std::operator+(&local_228,shaderPrefix,"vert");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_228);
    std::__cxx11::ostringstream::str();
    glu::VertexSource::VertexSource((VertexSource *)&local_250,&local_270);
    glu::ProgramSources::operator<<(pPVar4,&local_250);
    glu::VertexSource::~VertexSource((VertexSource *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  if ((VVar1 & 2) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_3e8);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar3 = std::operator<<((ostream *)local_3e8,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(vertices = 3) out;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"in ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3," gl_in[gl_MaxPatchVertices];\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"out ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3," gl_out[];\n");
    poVar3 = std::operator<<(poVar3,"\n");
    local_40a = 0;
    if ((stage & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) == 0) {
      std::allocator<char>::allocator();
      local_40a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"",&local_409);
    }
    else {
      std::operator+(&local_408,declCode,"\n");
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_408);
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[0] = 1.0;\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[1] = 1.0;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[0] = 1.0;\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[1] = 1.0;\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[2] = 1.0;\n");
    poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[3] = 1.0;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,
                             "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                            );
    local_432 = 0;
    if ((stage & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) == 0) {
      std::allocator<char>::allocator();
      local_432 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"",&local_431);
    }
    else {
      std::operator+(&local_430,"\n",mainCode);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_430);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string((string *)&local_430);
    if ((local_432 & 1) != 0) {
      std::allocator<char>::~allocator(&local_431);
    }
    std::__cxx11::string::~string((string *)&local_408);
    if ((local_40a & 1) != 0) {
      std::allocator<char>::~allocator(&local_409);
    }
    std::operator+(&local_458,shaderPrefix,"tesc");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_458);
    std::__cxx11::ostringstream::str();
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_480,&local_4a0);
    glu::ProgramSources::operator<<(pPVar4,&local_480);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::ostringstream::~ostringstream(local_3e8);
  }
  if ((VVar1 & 4) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_618);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar3 = std::operator<<((ostream *)local_618,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(triangles, equal_spacing, ccw) in;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"in ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3," gl_in[gl_MaxPatchVertices];\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"out ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3,";\n");
    poVar3 = std::operator<<(poVar3,"\n");
    local_63a = 0;
    if ((stage & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) == 0) {
      std::allocator<char>::allocator();
      local_63a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"",&local_639);
    }
    else {
      std::operator+(&local_638,declCode,"\n");
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_638);
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    vec3 px = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n");
    poVar3 = std::operator<<(poVar3,"    vec3 py = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n");
    poVar3 = std::operator<<(poVar3,"    vec3 pz = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n");
    poVar3 = std::operator<<(poVar3,"    gl_Position = vec4(px + py + pz, 1.0);\n");
    local_662 = 0;
    if ((stage & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) == 0) {
      std::allocator<char>::allocator();
      local_662 = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_660,"",&local_661);
    }
    else {
      std::__cxx11::string::string(local_660,(string *)mainCode);
    }
    poVar3 = std::operator<<(poVar3,local_660);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string(local_660);
    if ((local_662 & 1) != 0) {
      std::allocator<char>::~allocator(&local_661);
    }
    std::__cxx11::string::~string((string *)&local_638);
    if ((local_63a & 1) != 0) {
      std::allocator<char>::~allocator(&local_639);
    }
    std::operator+(&local_688,shaderPrefix,"tese");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_688);
    std::__cxx11::ostringstream::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_6b0,&local_6d0);
    glu::ProgramSources::operator<<(pPVar4,&local_6b0);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_6b0);
    std::__cxx11::string::~string((string *)&local_6d0);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::ostringstream::~ostringstream(local_618);
  }
  if ((VVar1 & 8) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_848);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar3 = std::operator<<((ostream *)local_848,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(triangles) in;\n");
    poVar3 = std::operator<<(poVar3,"layout(triangle_strip, max_vertices = 3) out;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"in ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3," gl_in[];\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"out ");
    poVar3 = std::operator<<(poVar3,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar3 = std::operator<<(poVar3,";\n");
    poVar3 = std::operator<<(poVar3,"\n");
    local_86a = 0;
    if ((stage & VK_SHADER_STAGE_GEOMETRY_BIT) == 0) {
      std::allocator<char>::allocator();
      local_86a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"",&local_869);
    }
    else {
      std::operator+(&local_868,declCode,"\n");
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_868);
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    gl_Position = gl_in[0].gl_Position;\n");
    poVar3 = std::operator<<(poVar3,"    EmitVertex();\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"    gl_Position = gl_in[1].gl_Position;\n");
    poVar3 = std::operator<<(poVar3,"    EmitVertex();\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"    gl_Position = gl_in[2].gl_Position;\n");
    poVar3 = std::operator<<(poVar3,"    EmitVertex();\n");
    local_892 = 0;
    if ((stage & VK_SHADER_STAGE_GEOMETRY_BIT) == 0) {
      std::allocator<char>::allocator();
      local_892 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_890,"",&local_891);
    }
    else {
      std::operator+(&local_890,"\n",mainCode);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_890);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string((string *)&local_890);
    if ((local_892 & 1) != 0) {
      std::allocator<char>::~allocator(&local_891);
    }
    std::__cxx11::string::~string((string *)&local_868);
    if ((local_86a & 1) != 0) {
      std::allocator<char>::~allocator(&local_869);
    }
    std::operator+(&local_8b8,shaderPrefix,"geom");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_8b8);
    std::__cxx11::ostringstream::str();
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_8e0,&local_900);
    glu::ProgramSources::operator<<(pPVar4,&local_8e0);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_8e0);
    std::__cxx11::string::~string((string *)&local_900);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::__cxx11::ostringstream::~ostringstream(local_848);
  }
  if ((VVar1 & 0x10) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_a78);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar3 = std::operator<<((ostream *)local_a78,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 o_color;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    local_a9a = 0;
    if ((stage & VK_SHADER_STAGE_FRAGMENT_BIT) == 0) {
      std::allocator<char>::allocator();
      local_a9a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a98,"",&local_a99);
    }
    else {
      std::operator+(&local_a98,declCode,"\n");
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_a98);
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    o_color = vec4(1.0);\n");
    local_ac2 = 0;
    if ((stage & VK_SHADER_STAGE_FRAGMENT_BIT) == 0) {
      std::allocator<char>::allocator();
      local_ac2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac0,"",&local_ac1);
    }
    else {
      std::operator+(&local_ac0,"\n",mainCode);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_ac0);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string((string *)&local_ac0);
    if ((local_ac2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_ac1);
    }
    std::__cxx11::string::~string((string *)&local_a98);
    if ((local_a9a & 1) != 0) {
      std::allocator<char>::~allocator(&local_a99);
    }
    std::operator+(&local_ae8,shaderPrefix,"frag");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_ae8);
    std::__cxx11::ostringstream::str();
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_b10,&local_b30);
    glu::ProgramSources::operator<<(pPVar4,&local_b10);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_b10);
    std::__cxx11::string::~string((string *)&local_b30);
    std::__cxx11::string::~string((string *)&local_ae8);
    std::__cxx11::ostringstream::~ostringstream(local_a78);
  }
  if ((VVar1 & 0x20) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_ca8);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar3 = std::operator<<((ostream *)local_ca8,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"layout(local_size_x = 1) in;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    local_cca = 0;
    if ((stage & VK_SHADER_STAGE_COMPUTE_BIT) == 0) {
      std::allocator<char>::allocator();
      local_cca = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_cc8,"",&local_cc9);
    }
    else {
      std::operator+(&local_cc8,declCode,"\n");
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_cc8);
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    local_cf2 = 0;
    if ((stage & VK_SHADER_STAGE_COMPUTE_BIT) == 0) {
      std::allocator<char>::allocator();
      local_cf2 = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_cf0,"",&local_cf1);
    }
    else {
      std::__cxx11::string::string(local_cf0,(string *)mainCode);
    }
    poVar3 = std::operator<<(poVar3,local_cf0);
    std::operator<<(poVar3,"}\n");
    std::__cxx11::string::~string(local_cf0);
    if ((local_cf2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_cf1);
    }
    std::__cxx11::string::~string((string *)&local_cc8);
    if ((local_cca & 1) != 0) {
      std::allocator<char>::~allocator(&local_cc9);
    }
    std::operator+(&local_d18,shaderPrefix,"comp");
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_d18);
    std::__cxx11::ostringstream::str();
    glu::ComputeSource::ComputeSource((ComputeSource *)&local_d40,&local_d60);
    glu::ProgramSources::operator<<(pPVar4,&local_d40);
    glu::ComputeSource::~ComputeSource((ComputeSource *)&local_d40);
    std::__cxx11::string::~string((string *)&local_d60);
    std::__cxx11::string::~string((string *)&local_d18);
    std::__cxx11::ostringstream::~ostringstream(local_ca8);
  }
  return;
}

Assistant:

void initPassthroughPrograms (SourceCollections&			programCollection,
							  const std::string&			shaderPrefix,
							  const std::string&			declCode,
							  const std::string&			mainCode,
							  const VkShaderStageFlagBits	stage)
{
	const VkShaderStageFlags	requiredStages	= getRequiredStages(stage);

	if (requiredStages & VK_SHADER_STAGE_VERTEX_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(location = 0) in vec4 v_in_position;\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_VERTEX_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = v_in_position;\n"
			<< (stage & VK_SHADER_STAGE_VERTEX_BIT ? mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "vert") << glu::VertexSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(vertices = 3) out;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << " gl_out[];\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_TessLevelInner[0] = 1.0;\n"
			<< "    gl_TessLevelInner[1] = 1.0;\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = 1.0;\n"
			<< "    gl_TessLevelOuter[1] = 1.0;\n"
			<< "    gl_TessLevelOuter[2] = 1.0;\n"
			<< "    gl_TessLevelOuter[3] = 1.0;\n"
			<< "\n"
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< (stage & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT ? "\n" + mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "tesc") << glu::TessellationControlSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(triangles, equal_spacing, ccw) in;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    vec3 px = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n"
			<< "    vec3 py = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n"
			<< "    vec3 pz = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n"
			<< "    gl_Position = vec4(px + py + pz, 1.0);\n"
			<< (stage & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT ? mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "tese") << glu::TessellationEvaluationSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_GEOMETRY_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = 3) out;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_GEOMETRY_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = gl_in[0].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = gl_in[1].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = gl_in[2].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< (stage & VK_SHADER_STAGE_GEOMETRY_BIT ? "\n" + mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "geom") << glu::GeometrySource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_FRAGMENT_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_FRAGMENT_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = vec4(1.0);\n"
			<< (stage & VK_SHADER_STAGE_FRAGMENT_BIT ? "\n" + mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "frag") << glu::FragmentSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_COMPUTE_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "\n"
			<< "layout(local_size_x = 1) in;\n"
			<< "\n"
			<< (stage & VK_SHADER_STAGE_COMPUTE_BIT ? declCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (stage & VK_SHADER_STAGE_COMPUTE_BIT ? mainCode : "")
			<< "}\n";

		programCollection.glslSources.add(shaderPrefix + "comp") << glu::ComputeSource(src.str());
	}
}